

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O3

void spell_iceball(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  CHAR_DATA *pCVar1;
  char *__format;
  int dam;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  CHAR_DATA *ach;
  char buf [4608];
  char local_1238 [4616];
  
  iVar3 = dice(level,6);
  ach = ch->in_room->people;
  if (ach != (CHAR_DATA *)0x0) {
    do {
      pCVar1 = ach->next_in_room;
      bVar2 = is_same_group(ach,ch);
      if ((!bVar2) && ((ch->cabal < 1 || (ch->cabal != ach->cabal)))) {
        bVar2 = is_safe(ch,ach);
        if (!bVar2) {
          bVar2 = is_npc(ch);
          if (!bVar2) {
            bVar2 = is_npc(ach);
            if ((!bVar2) &&
               ((ch->fighting == (CHAR_DATA *)0x0 || (ach->fighting == (CHAR_DATA *)0x0)))) {
              uVar4 = number_range(0,2);
              if (uVar4 < 3) {
                __format = (&PTR_anon_var_dwarf_c63b58_004893e8)[uVar4];
                pcVar5 = pers(ch,ach);
                sprintf(local_1238,__format,pcVar5);
              }
              if (ach != ch) {
                do_myell(ach,local_1238,ch);
              }
            }
          }
          bVar2 = saves_spell(level,ach,5);
          dam = iVar3;
          if (bVar2) {
            dam = iVar3 / 2;
          }
          damage_old(ch,ach,dam,sn,5,true);
        }
      }
      ach = pCVar1;
    } while (pCVar1 != (CHAR_DATA *)0x0);
  }
  return;
}

Assistant:

void spell_iceball(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *vch;
	CHAR_DATA *vch_next;
	char buf[MAX_STRING_LENGTH];

	int dam = dice(level, 6);

	for (vch = ch->in_room->people; vch != nullptr; vch = vch_next)
	{
		vch_next = vch->next_in_room;

		if (is_same_group(vch, ch))
			continue;

		if (ch->cabal > 0 && ch->cabal == vch->cabal)
			continue;

		if (is_safe(ch, vch))
			continue;

		if (!is_npc(ch) && !is_npc(vch) && (ch->fighting == nullptr || vch->fighting == nullptr))
		{
			switch (number_range(0, 2))
			{
				case 0:
				case 1:
					sprintf(buf, "Die, %s you sorcerous dog!", pers(ch, vch));
					break;
				case 2:
					sprintf(buf, "Help! %s is casting a spell on me!", pers(ch, vch));
			}

			if (vch != ch)
				do_myell(vch, buf, ch);
		}

		damage_old(ch, vch, (saves_spell(level, vch, DAM_COLD) ? dam / 2 : dam), sn, DAM_COLD, true);
	}
}